

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

QPixmap * QMessageBoxPrivate::standardIcon(Icon icon,QMessageBox *mb)

{
  QStyle *pQVar1;
  ulong uVar2;
  QSize *this;
  long in_RDX;
  int in_ESI;
  QPixmap *in_RDI;
  long in_FS_OFFSET;
  double dVar3;
  qreal dpr;
  int iconSize;
  QStyle *style;
  QIcon tmpIcon;
  QWidget *in_stack_ffffffffffffff68;
  QStyle *other;
  QPixmap *pQVar4;
  undefined1 local_38 [8];
  QIcon local_30;
  QIcon local_28;
  QIcon local_20;
  QIcon local_18;
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  if (in_RDX == 0) {
    pQVar1 = QApplication::style();
  }
  else {
    pQVar1 = QWidget::style(in_stack_ffffffffffffff68);
  }
  other = pQVar1;
  (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x47,0,in_RDX);
  local_10.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_10);
  this = (QSize *)(ulong)(in_ESI - 1);
  switch(this) {
  case (QSize *)0x0:
    (**(code **)(*(long *)pQVar1 + 0x100))(&local_18,pQVar1,9,0,in_RDX);
    QIcon::operator=((QIcon *)pQVar4,(QIcon *)other);
    QIcon::~QIcon(&local_18);
    break;
  case (QSize *)0x1:
    (**(code **)(*(long *)pQVar1 + 0x100))(&local_20,pQVar1,10,0,in_RDX);
    QIcon::operator=((QIcon *)pQVar4,(QIcon *)other);
    QIcon::~QIcon(&local_20);
    break;
  case (QSize *)0x2:
    (**(code **)(*(long *)pQVar1 + 0x100))(&local_28,pQVar1,0xb,0,in_RDX);
    QIcon::operator=((QIcon *)pQVar4,(QIcon *)other);
    QIcon::~QIcon(&local_28);
    break;
  case (QSize *)0x3:
    (**(code **)(*(long *)pQVar1 + 0x100))(&local_30,pQVar1,0xc,0,in_RDX);
    QIcon::operator=((QIcon *)pQVar4,(QIcon *)other);
    QIcon::~QIcon(&local_30);
  }
  uVar2 = QIcon::isNull();
  if ((uVar2 & 1) == 0) {
    if (in_RDX == 0) {
      QCoreApplication::instance();
      dVar3 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar3 = (double)QPaintDevice::devicePixelRatio();
    }
    QSize::QSize(this,(int)((ulong)dVar3 >> 0x20),SUB84(dVar3,0));
    QIcon::pixmap((QSize *)pQVar4,dVar3,(Mode)&local_10,(State)local_38);
  }
  else {
    QPixmap::QPixmap(pQVar4);
  }
  QIcon::~QIcon(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QPixmap QMessageBoxPrivate::standardIcon(QMessageBox::Icon icon, QMessageBox *mb)
{
    QStyle *style = mb ? mb->style() : QApplication::style();
    int iconSize = style->pixelMetric(QStyle::PM_MessageBoxIconSize, nullptr, mb);
    QIcon tmpIcon;
    switch (icon) {
    case QMessageBox::Information:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxInformation, nullptr, mb);
        break;
    case QMessageBox::Warning:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxWarning, nullptr, mb);
        break;
    case QMessageBox::Critical:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxCritical, nullptr, mb);
        break;
    case QMessageBox::Question:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxQuestion, nullptr, mb);
        break;
    default:
        break;
    }
    if (!tmpIcon.isNull()) {
        qreal dpr = mb ? mb->devicePixelRatio() : qApp->devicePixelRatio();
        return tmpIcon.pixmap(QSize(iconSize, iconSize), dpr);
    }
    return QPixmap();
}